

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.c
# Opt level: O3

_Bool ecs_enable_locking(ecs_world_t *world,_Bool enable)

{
  _Bool _Var1;
  ecs_os_mutex_t eVar2;
  ecs_os_cond_t eVar3;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,enable) == 0) {
    if (world->locking_enabled != false) {
      (*ecs_os_api.mutex_free_)(world->mutex);
      (*ecs_os_api.mutex_free_)(world->thr_sync);
      (*ecs_os_api.cond_free_)(world->thr_cond);
    }
  }
  else if (world->locking_enabled == false) {
    eVar2 = (*ecs_os_api.mutex_new_)();
    world->mutex = eVar2;
    eVar2 = (*ecs_os_api.mutex_new_)();
    world->thr_sync = eVar2;
    eVar3 = (*ecs_os_api.cond_new_)();
    world->thr_cond = eVar3;
  }
  _Var1 = world->locking_enabled;
  world->locking_enabled = enable;
  return _Var1;
}

Assistant:

bool ecs_enable_locking(
    ecs_world_t *world,
    bool enable)
{
    if (enable) {
        if (!world->locking_enabled) {
            world->mutex = ecs_os_mutex_new();
            world->thr_sync = ecs_os_mutex_new();
            world->thr_cond = ecs_os_cond_new();
        }
    } else {
        if (world->locking_enabled) {
            ecs_os_mutex_free(world->mutex);
            ecs_os_mutex_free(world->thr_sync);
            ecs_os_cond_free(world->thr_cond);
        }
    }

    bool old = world->locking_enabled;
    world->locking_enabled = enable;
    return old;
}